

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::ConstraintKeeper(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
                   *this,FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *cvt,char *nm,char *optnm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  char *__s;
  long *plVar4;
  size_type *psVar5;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  BasicConstraintKeeper::BasicConstraintKeeper
            (&this->super_BasicConstraintKeeper,
             (BasicValuePresolver *)
             &(cvt->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .value_presolver_,nm,optnm);
  (this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper =
       (_func_int **)&PTR__ConstraintKeeper_00447b60;
  this->cvt_ = cvt;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->cons_).
  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
  ::_M_initialize_map(&(this->cons_).
                       super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>::Container>_>
                      ,0);
  this->i_cvt_last_ = -1;
  this->n_bridged_or_unused_ = 0;
  this->i_2add_next_ = 0;
  local_98 = &this->cons_;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"ConstraintKeeper< ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
  local_118 = &local_108;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_108 = *plVar4;
    lStack_100 = plVar3[3];
  }
  else {
    local_108 = *plVar4;
    local_118 = (long *)*plVar3;
  }
  local_110 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_f8 = &local_e8;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_e8 = *plVar4;
    lStack_e0 = plVar3[3];
  }
  else {
    local_e8 = *plVar4;
    local_f8 = (long *)*plVar3;
  }
  local_f0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_c8 = *plVar4;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar4;
    local_d8 = (long *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::GetTypeName();
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a8 = *plVar4;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar4;
    local_b8 = (long *)*plVar3;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  paVar1 = &(this->desc_).field_2;
  (this->desc_)._M_dataplus._M_p = (pointer)paVar1;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    paVar1->_M_allocated_capacity = *psVar5;
    *(long *)((long)&(this->desc_).field_2 + 8) = lVar2;
  }
  else {
    (this->desc_)._M_dataplus._M_p = (pointer)*plVar3;
    (this->desc_).field_2._M_allocated_capacity = *psVar5;
  }
  (this->desc_)._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  __s = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_b8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_BasicConstraintKeeper).value_node_.name_,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  ConstraintManager::AddConstraintKeeper
            (&(this->cvt_->
              super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ).
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              .super_FlatModel<mp::DefaultFlatModelParams>.super_ConstraintManager,
             &this->super_BasicConstraintKeeper,5000.0);
  return;
}

Assistant:

ConstraintKeeper(Converter& cvt, const char* nm, const char* optnm) :
      BasicConstraintKeeper(cvt.GetValuePresolver(), nm, optnm), cvt_(cvt)
  {
    GetValueNode().SetName(GetShortTypeName());  // change value node name
    GetConverter().AddConstraintKeeper(*this, ConversionPriority());
  }